

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
::AdvancePastEmptyBuckets
          (DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
           *this)

{
  bool bVar1;
  Abbrev *pAVar2;
  bool local_6a;
  bool local_69;
  undefined1 local_50 [8];
  Abbrev Tombstone;
  Abbrev Empty;
  DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
  *this_local;
  
  if (this->Ptr <= this->End) {
    DWARFDebugNames::AbbrevMapInfo::getEmptyKey();
    DWARFDebugNames::AbbrevMapInfo::getTombstoneKey();
    while( true ) {
      local_69 = false;
      if (this->Ptr != this->End) {
        pAVar2 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(this->Ptr);
        bVar1 = DWARFDebugNames::AbbrevMapInfo::isEqual
                          (pAVar2,(Abbrev *)
                                  &Tombstone.Attributes.
                                   super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_6a = true;
        if (!bVar1) {
          pAVar2 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(this->Ptr);
          local_6a = DWARFDebugNames::AbbrevMapInfo::isEqual(pAVar2,(Abbrev *)local_50);
        }
        local_69 = local_6a;
      }
      if (local_69 == false) break;
      this->Ptr = this->Ptr + 1;
    }
    DWARFDebugNames::Abbrev::~Abbrev((Abbrev *)local_50);
    DWARFDebugNames::Abbrev::~Abbrev
              ((Abbrev *)
               &Tombstone.Attributes.
                super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("Ptr <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x4e0,
                "void llvm::DenseMapIterator<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, true>::AdvancePastEmptyBuckets() [KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, Bucket = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, IsConst = true]"
               );
}

Assistant:

void AdvancePastEmptyBuckets() {
    assert(Ptr <= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr->getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr->getFirst(), Tombstone)))
      ++Ptr;
  }